

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_client.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  EVP_PKEY_CTX *ctx;
  shared_ptr<Liby::Channel> input_chan;
  shared_ptr<Liby::Connection> input_conn;
  shared_ptr<Liby::UdpSocket> udp_client;
  UdpConnection *p_uconn;
  EventLoopGroup group;
  undefined1 local_179;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  shared_ptr<Liby::FileDescriptor> local_158;
  shared_ptr<Liby::Socket> local_148;
  Connection *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  undefined1 local_128 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  int local_fc;
  pointer local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  EventLoopGroup local_a8;
  
  if (argc == 3) {
    local_178._0_8_ = local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"EPOLL","");
    Liby::EventLoopGroup::EventLoopGroup(&local_a8,0,(string *)local_178);
    if ((undefined1 *)local_178._0_8_ != local_168) {
      operator_delete((void *)local_178._0_8_);
    }
    local_108 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string((string *)local_178,argv[1],(allocator *)&local_148);
    std::__cxx11::string::string((string *)&local_138,argv[2],(allocator *)&local_158);
    Liby::EventLoopGroup::creatUdpClient
              ((EventLoopGroup *)(local_128 + 0x10),(string *)&local_a8,(string *)local_178);
    if (local_138 != (Connection *)local_128) {
      operator_delete(local_138);
    }
    if ((undefined1 *)local_178._0_8_ != local_168) {
      operator_delete((void *)local_178._0_8_);
    }
    local_178._8_8_ = 0;
    local_168._8_8_ =
         std::
         _Function_handler<void_(Liby::UdpConnection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/udp_client.cpp:19:31)>
         ::_M_invoke;
    local_168._0_8_ =
         std::
         _Function_handler<void_(Liby::UdpConnection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/udp_client.cpp:19:31)>
         ::_M_manager;
    local_178._0_8_ = &local_108;
    std::function<void_(Liby::UdpConnection_&)>::operator=
              ((function<void_(Liby::UdpConnection_&)> *)(local_128._16_8_ + 0x100),
               (function<void_(Liby::UdpConnection_&)> *)local_178);
    if ((code *)local_168._0_8_ != (code *)0x0) {
      (*(code *)local_168._0_8_)(local_178,local_178,3);
    }
    local_178._0_8_ = (pointer)0x0;
    local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_168._8_8_ =
         std::
         _Function_handler<void_(Liby::UdpConnection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/udp_client.cpp:23:28)>
         ::_M_invoke;
    local_168._0_8_ =
         std::
         _Function_handler<void_(Liby::UdpConnection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/udp_client.cpp:23:28)>
         ::_M_manager;
    std::function<void_(Liby::UdpConnection_&)>::operator=
              ((function<void_(Liby::UdpConnection_&)> *)(local_128._16_8_ + 0xe0),
               (function<void_(Liby::UdpConnection_&)> *)local_178);
    if ((code *)local_168._0_8_ != (code *)0x0) {
      (*(code *)local_168._0_8_)(local_178,local_178,3);
    }
    local_138 = (Connection *)Liby::Poller::curr_thread_poller();
    local_148.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((ulong)local_148.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
         << 0x20);
    local_178._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Channel,std::allocator<Liby::Channel>,Liby::Poller*,int>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8),(Channel **)local_178,
               (allocator<Liby::Channel> *)&local_158,(Poller **)&local_138,(int *)&local_148);
    local_fc = 0;
    local_158.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::FileDescriptor,std::allocator<Liby::FileDescriptor>,int>
              (&local_158.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(FileDescriptor **)&local_158,
               (allocator<Liby::FileDescriptor> *)&local_179,&local_fc);
    local_148.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Socket,std::allocator<Liby::Socket>,std::shared_ptr<Liby::FileDescriptor>>
              (&local_148.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (Socket **)&local_148,(allocator<Liby::Socket> *)&local_179,&local_158);
    local_138 = (Connection *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Connection,std::allocator<Liby::Connection>,std::shared_ptr<Liby::Socket>>
              (&local_130,&local_138,(allocator<Liby::Connection> *)&local_179,&local_148);
    std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<Liby::Connection,Liby::Connection>
              ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)&local_138,local_138);
    if (local_148.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_158.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_f8 = (pointer)local_178._0_8_;
    local_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_178._8_8_ + 8) = *(_Atomic_word *)(local_178._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_178._8_8_ + 8) = *(_Atomic_word *)(local_178._8_8_ + 8) + 1;
      }
    }
    ctx = (EVP_PKEY_CTX *)&local_f8;
    Liby::Connection::setChannel(local_138,(ChanPtr *)ctx);
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    Liby::Connection::init(local_138,ctx);
    Liby::Connection::init1(local_138);
    local_c8._8_8_ = 0;
    pcStack_b0 = std::
                 _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/udp_client.cpp:33:28)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/udp_client.cpp:33:28)>
               ::_M_manager;
    local_c8._M_unused._M_object = &local_108;
    std::function<void_(Liby::Connection_&)>::operator=
              (&local_138->readEventCallback_,(function<void_(Liby::Connection_&)> *)&local_c8);
    if (local_b8 != (code *)0x0) {
      (*local_b8)(&local_c8,&local_c8,3);
    }
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0;
    local_d0 = std::
               _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
               ::_M_manager;
    Liby::EventLoopGroup::run(&local_a8,(BoolFunctor *)&local_e8);
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
    }
    if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
    }
    Liby::EventLoopGroup::~EventLoopGroup(&local_a8);
    iVar1 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"usage: ./udp_client host service",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 3) {
        cerr << "usage: ./udp_client host service" << endl;
        return 1;
    }

    try {
        EventLoopGroup group;
        UdpConnection *p_uconn = nullptr;
        auto udp_client = group.creatUdpClient(argv[1], argv[2]);
        udp_client->onConnect([&](UdpConnection &uconn) {
            p_uconn = &uconn;
            //            uconn.send(" ");
        });
        udp_client->onRead([&](UdpConnection &uconn) {
            cout << uconn.read().retriveveAllAsString() << endl;
        });
        auto input_chan =
            std::make_shared<Channel>(Poller::curr_thread_poller(), 0);
        auto input_conn = std::make_shared<Connection>(
            std::make_shared<Socket>(std::make_shared<FileDescriptor>(0)));
        input_conn->setChannel(input_chan);
        input_conn->init();
        input_conn->init1();
        input_conn->onRead([&](Connection &in) {
            if (p_uconn == nullptr)
                return;
            auto str = in.read().retriveveAllAsString();
            //            cout << "input " << str << endl;
            p_uconn->send(str, [str] {
                //                cout << "try to send " << str << endl;
            });
        });
        group.run();
    } catch (const char *err) { cerr << err << endl; }
}